

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall
TrodesMsg::addcontents<char_const*,binarydata>
          (TrodesMsg *this,string *f,char *head,binarydata *tail)

{
  ulong uVar1;
  string *this_00;
  TrodesMsg *this_01;
  string *in_RDX;
  ulong in_RSI;
  char in_DIL;
  string e;
  binarydata *in_stack_fffffffffffffeb8;
  binarydata *in_stack_fffffffffffffec0;
  allocator *paVar2;
  binarydata *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  TrodesMsg *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [35];
  undefined1 local_35;
  allocator local_21 [9];
  string *local_18;
  
  local_18 = in_RDX;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_01 = (TrodesMsg *)std::__cxx11::string::operator[](in_RSI);
    paVar2 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)local_18,paVar2);
    appendArg(this_01,(char)((ulong)paVar2 >> 0x38),local_18);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::__cxx11::string::operator[](in_RSI);
    std::__cxx11::string::push_back(in_DIL);
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,in_RSI);
    binarydata::binarydata(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    addcontents<binarydata>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    binarydata::~binarydata((binarydata *)0x1c4679);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    return;
  }
  local_35 = 1;
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,"TrodesMsg Error: Mismatched format string and variables",local_21);
  local_35 = 0;
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void addcontents(std::string f, H head, T... tail){
        try{
            if(f.empty())
                throw std::string("TrodesMsg Error: Mismatched format string and variables");
            appendArg(f[0], head);
            format.push_back(f[0]);
            addcontents(f.substr(1), tail...);
        } catch(std::string e){
            std::cerr << "[TrodesMsg::addcontents Error] " << e << "\n";
        } catch(...){
            std::cout << "[TrodesMsg::addcontents Error] Unknown exception thrown!\n";
        }
    }